

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O3

strbuf * ssh_cipher_decrypt_wrapper(ssh_cipher *c,ptrlen input)

{
  strbuf *psVar1;
  
  if (input.len % (ulong)(long)c->vt->blksize == 0) {
    psVar1 = strbuf_dup(input);
    (*c->vt->decrypt)(c,psVar1->u,(int)psVar1->len);
    return psVar1;
  }
  fatal_error("ssh_cipher_decrypt: needs a multiple of %d bytes");
}

Assistant:

strbuf *ssh_cipher_decrypt_wrapper(ssh_cipher *c, ptrlen input)
{
    if (input.len % ssh_cipher_alg(c)->blksize)
        fatal_error("ssh_cipher_decrypt: needs a multiple of %d bytes",
                    ssh_cipher_alg(c)->blksize);
    strbuf *sb = strbuf_dup(input);
    ssh_cipher_decrypt(c, sb->u, sb->len);
    return sb;
}